

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeRepresentation::~IfcShapeRepresentation
          (IfcShapeRepresentation *this)

{
  ~IfcShapeRepresentation
            ((IfcShapeRepresentation *)
             &this[-1].super_IfcShapeModel.super_IfcRepresentation.field_0x28);
  return;
}

Assistant:

IfcShapeRepresentation() : Object("IfcShapeRepresentation") {}